

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>::flush_output
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true> *this,int outputs)

{
  int outputs_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true> *this_local;
  
  update_just_in_time_cards(this);
  if ((outputs & 1U) != 0) {
    update_video(this);
  }
  if ((outputs & 2U) != 0) {
    update_audio(this);
    Concurrency::AsyncTaskQueue<false,_true,_void>::perform(&this->audio_queue_);
  }
  return;
}

Assistant:

void flush_output(int outputs) final {
			update_just_in_time_cards();

			if(outputs & Output::Video) {
				update_video();
			}
			if(outputs & Output::Audio) {
				update_audio();
				audio_queue_.perform();
			}
		}